

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionSettings.cpp
# Opt level: O0

void __thiscall FIX::SessionSettings::set(SessionSettings *this,Dictionary *defaults)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_30;
  _Base_ptr local_28;
  _Self local_20;
  iterator i;
  Dictionary *defaults_local;
  SessionSettings *this_local;
  
  i._M_node = (_Base_ptr)defaults;
  Dictionary::operator=(&this->m_defaults,defaults);
  local_20._M_node =
       (_Base_ptr)
       std::
       map<FIX::SessionID,_FIX::Dictionary,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
       ::begin(&this->m_settings);
  local_28 = (_Base_ptr)
             std::
             map<FIX::SessionID,_FIX::Dictionary,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
             ::begin(&this->m_settings);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::
         map<FIX::SessionID,_FIX::Dictionary,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
         ::end(&this->m_settings);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>::operator->
                       (&local_20);
    Dictionary::merge(&ppVar2->second,(Dictionary *)i._M_node);
    std::_Rb_tree_iterator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>::operator++(&local_20)
    ;
  }
  return;
}

Assistant:

void SessionSettings::set( const Dictionary& defaults ) EXCEPT ( ConfigError )
{
  m_defaults = defaults;
  Dictionaries::iterator i = m_settings.begin();
  for( i = m_settings.begin(); i != m_settings.end(); ++i )
    i->second.merge( defaults );
}